

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O1

bool CheckRelativePath(string *local,string *remote,string *expected)

{
  bool bVar1;
  ostream *poVar2;
  string result;
  string local_40;
  
  cmsys::SystemTools::RelativePath(&local_40,local,remote);
  bVar1 = cmsys::SystemTools::ComparePath(expected,&local_40);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"RelativePath(",0xd);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(local->_M_dataplus)._M_p,local->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(remote->_M_dataplus)._M_p,remote->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,")  yielded ",0xb);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_40._M_dataplus._M_p,local_40._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," instead of ",0xc);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(expected->_M_dataplus)._M_p,expected->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

static bool CheckRelativePath(const std::string& local,
                              const std::string& remote,
                              const std::string& expected)
{
  std::string result = kwsys::SystemTools::RelativePath(local, remote);
  if (!kwsys::SystemTools::ComparePath(expected, result)) {
    std::cerr << "RelativePath(" << local << ", " << remote << ")  yielded "
              << result << " instead of " << expected << std::endl;
    return false;
  }
  return true;
}